

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void rw::ps2::registerADCPlugin(void)

{
  adcOffset = Geometry::registerPlugin(0x18,0x134,createADC,destroyADC,copyADC);
  Geometry::registerPluginStream(0x134,readADC,writeADC,getSizeADC);
  return;
}

Assistant:

void
registerADCPlugin(void)
{
	adcOffset = Geometry::registerPlugin(sizeof(ADCData), ID_ADC,
	                                     createADC, destroyADC, copyADC);
	Geometry::registerPluginStream(ID_ADC,
	                               readADC,
	                               writeADC,
	                               getSizeADC);
}